

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

wchar_t * __thiscall ON_Font::FontFaceName(ON_Font *this)

{
  bool bVar1;
  wchar_t *pwVar2;
  ON_wString *this_00;
  
  bVar1 = ON_wString::IsNotEmpty(&this->m_loc_windows_logfont_name);
  this_00 = &this->m_en_windows_logfont_name;
  if (bVar1) {
    this_00 = &this->m_loc_windows_logfont_name;
  }
  pwVar2 = ON_wString::operator_cast_to_wchar_t_(this_00);
  return pwVar2;
}

Assistant:

const wchar_t* ON_Font::FontFaceName() const
{
  // Was never a "real" face name. 
  // Always returned a value from or used in a Windows GDI LOGFONT.lfFaceName[].
  return
    m_loc_windows_logfont_name.IsNotEmpty()
    ? static_cast<const wchar_t*>(m_loc_windows_logfont_name)
    : static_cast<const wchar_t*>(m_en_windows_logfont_name);
}